

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::incoming_connection_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,incoming_connection_alert *this)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  size_t sVar3;
  endpoint *in_RDX;
  char msg [600];
  string local_298;
  char local_278 [608];
  
  aux::print_endpoint_abi_cxx11_(&local_298,(aux *)&this->endpoint,in_RDX);
  _Var1._M_p = local_298._M_dataplus._M_p;
  pcVar2 = socket_type_name(this->socket_type);
  snprintf(local_278,600,"incoming connection from %s (%s)",_Var1._M_p,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_278);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_278,local_278 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string incoming_connection_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[600];
		std::snprintf(msg, sizeof(msg), "incoming connection from %s (%s)"
			, print_endpoint(endpoint).c_str(), socket_type_name(socket_type));
		return msg;
#endif
	}